

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void clear_buckets(ecs_map_t *map)

{
  int iVar1;
  ecs_bucket_t *peVar2;
  int local_1c;
  int32_t count;
  int32_t i;
  ecs_bucket_t *buckets;
  ecs_map_t *map_local;
  
  peVar2 = map->buckets;
  iVar1 = map->bucket_count;
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    clear_bucket(peVar2 + local_1c);
  }
  (*ecs_os_api.free_)(peVar2);
  map->buckets = (ecs_bucket_t *)0x0;
  map->bucket_count = 0;
  return;
}

Assistant:

static
void clear_buckets(
    ecs_map_t *map)
{
    ecs_bucket_t *buckets = map->buckets;
    int32_t i, count = map->bucket_count;
    for (i = 0; i < count; i ++) {
        clear_bucket(&buckets[i]);
    }
    ecs_os_free(buckets);
    map->buckets = NULL;
    map->bucket_count = 0;
}